

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>>::
find<0ul,char_const(&)[4]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>> *this,
          char (*params) [7])

{
  char (*params_00) [7];
  Maybe<kj::StringPtr_&> MVar1;
  long lVar2;
  Maybe<unsigned_long> MVar3;
  HashIndex<kj::_::(anonymous_namespace)::BadHasher> local_28 [8];
  long local_20;
  
  params_00 = *(char (**) [7])params;
  MVar3 = HashIndex<kj::_::(anonymous_namespace)::BadHasher>::find<kj::StringPtr,char_const(&)[4]>
                    (local_28,*(ArrayPtr<kj::StringPtr> *)(params[6] + 6),params_00);
  MVar1.ptr = MVar3.ptr._0_8_;
  if (local_28[0] == (HashIndex<kj::_::(anonymous_namespace)::BadHasher>)0x1) {
    MVar1.ptr = (StringPtr *)(local_20 * 0x10);
    lVar2 = (long)params_00 + (long)MVar1.ptr;
  }
  else {
    lVar2 = 0;
  }
  *(long *)this = lVar2;
  return (Maybe<kj::StringPtr_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}